

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O2

void duckdb::UnsupportedEquiWidth(DataChunk *args,ExpressionState *state,Vector *param_3)

{
  Expression *expr;
  BinderException *this;
  reference pvVar1;
  allocator local_59;
  LogicalType local_58;
  string local_40;
  
  this = (BinderException *)__cxa_allocate_exception(0x10);
  expr = state->expr;
  ::std::__cxx11::string::string
            ((string *)&local_40,"Unsupported type \"%s\" for equi_width_bins",&local_59);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  LogicalType::LogicalType(&local_58,&pvVar1->type);
  BinderException::BinderException<duckdb::LogicalType>(this,expr,&local_40,&local_58);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void UnsupportedEquiWidth(DataChunk &args, ExpressionState &state, Vector &) {
	throw BinderException(state.expr, "Unsupported type \"%s\" for equi_width_bins", args.data[0].GetType());
}